

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

string * __thiscall
pbrt::SpectrumConstantTexture::ToString_abi_cxx11_(SpectrumConstantTexture *this)

{
  string *in_RDI;
  SpectrumHandle *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::SpectrumHandle_const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string SpectrumConstantTexture::ToString() const {
    return StringPrintf("[ SpectrumConstantTexture value: %s ]", value);
}